

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O3

vector<long,_std::allocator<long>_> *
CoreML::defaultSizeOf
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,ImageFeatureType *params)

{
  uint uVar1;
  ImageFeatureType_EnumeratedImageSizes *pIVar2;
  vector<long,_std::allocator<long>_> *extraout_RAX;
  vector<long,_std::allocator<long>_> *pvVar3;
  LogMessage *pLVar4;
  vector<long,_std::allocator<long>_> *extraout_RAX_00;
  vector<long,_std::allocator<long>_> *extraout_RAX_01;
  iterator iVar5;
  undefined1 *puVar6;
  pointer *pplVar7;
  LogFinisher local_69;
  vector<long,_std::allocator<long>_> *local_68;
  LogMessage local_60;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60._0_8_ = params->width_;
  if ((0 < (long)local_60._0_8_) && (0 < params->height_)) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (__return_storage_ptr__,(iterator)0x0,(long *)&local_60);
    pvVar3 = (vector<long,_std::allocator<long>_> *)params->height_;
    iVar5._M_current =
         (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar5._M_current ==
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      local_60._0_8_ = pvVar3;
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (__return_storage_ptr__,iVar5,(long *)&local_60);
      return extraout_RAX;
    }
    *iVar5._M_current = (long)pvVar3;
LAB_002ce5ec:
    (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
    super__Vector_impl_data._M_finish = iVar5._M_current + 1;
    return pvVar3;
  }
  uVar1 = params->_oneof_case_[0];
  if (uVar1 == 0x1f) {
    puVar6 = (undefined1 *)((params->SizeFlexibility_).imagesizerange_)->widthrange_;
    if ((SizeRange *)puVar6 == (SizeRange *)0x0) {
      puVar6 = Specification::_SizeRange_default_instance_;
    }
    local_60._0_8_ = ((SizeRange *)puVar6)->lowerbound_;
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (__return_storage_ptr__,(iterator)0x0,(long *)&local_60);
    if (params->_oneof_case_[0] == 0x1f) {
      puVar6 = (undefined1 *)(params->SizeFlexibility_).imagesizerange_;
    }
    else {
      puVar6 = Specification::_ImageFeatureType_ImageSizeRange_default_instance_;
    }
    iVar5._M_current =
         (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    pvVar3 = (vector<long,_std::allocator<long>_> *)
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    puVar6 = (undefined1 *)((ImageFeatureType_ImageSizeRange *)puVar6)->heightrange_;
    if ((SizeRange *)puVar6 == (SizeRange *)0x0) {
      puVar6 = Specification::_SizeRange_default_instance_;
    }
    local_60._0_8_ = ((SizeRange *)puVar6)->lowerbound_;
    if ((vector<long,_std::allocator<long>_> *)iVar5._M_current == pvVar3) {
      std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                (__return_storage_ptr__,iVar5,(long *)&local_60);
      return extraout_RAX_00;
    }
    *iVar5._M_current = local_60._0_8_;
    goto LAB_002ce5ec;
  }
  if (uVar1 != 0x15) {
    return (vector<long,_std::allocator<long>_> *)(ulong)uVar1;
  }
  pIVar2 = (params->SizeFlexibility_).enumeratedsizes_;
  if ((pIVar2->sizes_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
    iVar5._M_current =
         (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    local_68 = *(vector<long,_std::allocator<long>_> **)
                ((long)((pIVar2->sizes_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x10);
    if (iVar5._M_current !=
        (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      *iVar5._M_current = (long)local_68;
      (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      goto LAB_002ce66d;
    }
  }
  else {
    local_68 = *(vector<long,_std::allocator<long>_> **)
                ((long)((pIVar2->sizes_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x10);
    iVar5._M_current = (long *)0x0;
  }
  std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
            (__return_storage_ptr__,iVar5,(long *)&local_68);
LAB_002ce66d:
  pplVar7 = &(__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  if (params->_oneof_case_[0] == 0x15) {
    puVar6 = (undefined1 *)(params->SizeFlexibility_).enumeratedsizes_;
  }
  else {
    puVar6 = Specification::_ImageFeatureType_EnumeratedImageSizes_default_instance_;
  }
  if ((((ImageFeatureType_EnumeratedImageSizes *)puVar6)->sizes_).super_RepeatedPtrFieldBase.
      current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x358);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_69,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  local_68 = *(vector<long,_std::allocator<long>_> **)
              ((long)((((ImageFeatureType_EnumeratedImageSizes *)puVar6)->sizes_).
                      super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18);
  iVar5._M_current = *pplVar7;
  if (iVar5._M_current !=
      (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    *iVar5._M_current = (long)local_68;
    *pplVar7 = iVar5._M_current + 1;
    return local_68;
  }
  std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
            (__return_storage_ptr__,iVar5,(long *)&local_68);
  return extraout_RAX_01;
}

Assistant:

static std::vector<int64_t> defaultSizeOf(const Specification::ImageFeatureType &params) {
        std::vector<int64_t> defaultSize;

        if (params.width() > 0 && params.height() > 0) {
            defaultSize.push_back((int64_t)params.width());
            defaultSize.push_back((int64_t)params.height());
            return defaultSize;
        }

        switch (params.SizeFlexibility_case()) {
            case Specification::ImageFeatureType::kEnumeratedSizes:
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).width());
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).height());
                break;
            case Specification::ImageFeatureType::kImageSizeRange:
                defaultSize.push_back((int64_t)params.imagesizerange().widthrange().lowerbound());
                defaultSize.push_back((int64_t)params.imagesizerange().heightrange().lowerbound());
                break;
            case Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET:
                break;
        }
        return defaultSize;
    }